

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_truncated_tree_fix_tree_index_impl.h
# Opt level: O0

double __thiscall
ted::
TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
::tree_dist(TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  UnitCostModelLD<label::StringLabel> *pUVar1;
  initializer_list<double> __l;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  const_reference pvVar6;
  double *pdVar7;
  int *piVar8;
  reference piVar9;
  double dVar10;
  double dVar11;
  double local_128;
  double local_120;
  double local_118;
  iterator local_110;
  undefined8 local_108;
  double local_100;
  double local_f8;
  int local_ec;
  int local_e8 [2];
  double local_e0;
  double fd_read;
  double td_read;
  int local_c4;
  int local_c0;
  int local_bc [3];
  undefined1 local_b0 [4];
  int j_1;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  reverse_iterator rit;
  int depth_n;
  int post_n;
  int n_1;
  int n;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> nodes_to_traverse;
  TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *pTStack_58;
  int max_depth;
  double candidate_result;
  int local_48;
  int i_1;
  int j;
  int y_off;
  int x_off;
  int y_size;
  int x_size;
  int k_local;
  int y_local;
  int x_local;
  TreeIndexAll *t2_local;
  TreeIndexAll *t1_local;
  TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *this_local;
  
  y_size = k;
  x_size = y;
  k_local = x;
  _y_local = t2;
  t2_local = t1;
  t1_local = (TreeIndexAll *)this;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToSize).postl_to_size_,(long)x);
  x_off = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(_y_local->super_PostLToSize).postl_to_size_,(long)x_size);
  y_off = *pvVar6;
  j = k_local - x_off;
  i_1 = x_size - y_off;
  pdVar7 = data_structures::BandMatrix<double>::at
                     (&(this->
                       super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       ).
                       super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       .fd_,0,0);
  *pdVar7 = 0.0;
  for (local_48 = 1; iVar5 = local_48, piVar8 = std::min<int>(&y_off,&e), iVar5 <= *piVar8;
      local_48 = local_48 + 1) {
    pdVar7 = data_structures::BandMatrix<double>::read_at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,0,(long)(local_48 + -1));
    dVar11 = *pdVar7;
    pUVar1 = (this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .
             super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .c_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(_y_local->super_PostLToLabelId).postl_to_label_id_,(long)(local_48 + i_1))
    ;
    dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar1,*pvVar6);
    pdVar7 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,0,(long)local_48);
    *pdVar7 = dVar11 + dVar10;
  }
  if (e + 1 <= y_off) {
    dVar11 = std::numeric_limits<double>::infinity();
    pdVar7 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,0,(long)(e + 1));
    *pdVar7 = dVar11;
  }
  for (candidate_result._4_4_ = 1; iVar5 = candidate_result._4_4_, piVar8 = std::min<int>(&x_off,&e)
      , iVar5 <= *piVar8; candidate_result._4_4_ = candidate_result._4_4_ + 1) {
    pdVar7 = data_structures::BandMatrix<double>::read_at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,(long)(candidate_result._4_4_ + -1),0);
    dVar11 = *pdVar7;
    pUVar1 = (this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .
             super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .c_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t2_local->super_PostLToLabelId).postl_to_label_id_,
                        (long)(candidate_result._4_4_ + j));
    dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar1,*pvVar6);
    pdVar7 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,(long)candidate_result._4_4_,0);
    *pdVar7 = dVar11 + dVar10;
  }
  if (e + 1 <= x_off) {
    dVar11 = std::numeric_limits<double>::infinity();
    pdVar7 = data_structures::BandMatrix<double>::at
                       (&(this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_,(long)(e + 1),0);
    *pdVar7 = dVar11;
  }
  pTStack_58 = (TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                *)std::numeric_limits<double>::infinity();
  nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_78);
  pvVar6 = std::vector<int,_std::allocator<int>_>::at
                     (&(t2_local->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,
                      (long)k_local);
  iVar5 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::at
                     (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)k_local);
  if (*pvVar6 + e + 1 < iVar5) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::at
                       (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)k_local);
    nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = *pvVar6 + e + 1;
    depth_n = 1;
    rit.current._M_current._4_4_ = 0;
    while (depth_n <= x_off) {
      iVar5 = (x_off - depth_n) + 1 + j;
      pvVar6 = std::vector<int,_std::allocator<int>_>::at
                         (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)iVar5);
      rit.current._M_current._4_4_ = *pvVar6;
      rit.current._M_current._0_4_ = (x_off - depth_n) + 1;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_78,(value_type_conflict *)&rit);
      if (rit.current._M_current._4_4_ ==
          nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::at
                           (&(t2_local->super_PostLToSize).postl_to_size_,(long)iVar5);
        depth_n = *pvVar6 + depth_n;
      }
      else {
        depth_n = depth_n + 1;
      }
    }
  }
  else {
    pvVar6 = std::vector<int,_std::allocator<int>_>::at
                       (&(t2_local->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,
                        (long)k_local);
    nodes_to_traverse.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = *pvVar6;
    for (post_n = x_off; 0 < post_n; post_n = post_n + -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_78,&post_n);
    }
  }
  std::vector<int,_std::allocator<int>_>::rbegin((vector<int,_std::allocator<int>_> *)local_a0);
  do {
    std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_b0);
    bVar4 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                             *)local_a0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                             *)local_b0);
    if (!bVar4) {
      (this->
      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      ).
      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      subproblem_counter_ =
           (this->
           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           ).
           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           .super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
           subproblem_counter_ + 1;
      pdVar7 = data_structures::BandMatrix<double>::read_at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)(x_off + -1),(long)y_off);
      dVar11 = *pdVar7;
      pUVar1 = (this->
               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               ).
               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .c_;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)k_local);
      local_128 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar1,*pvVar6);
      local_128 = dVar11 + local_128;
      pdVar7 = data_structures::BandMatrix<double>::read_at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)x_off,(long)(y_off + -1));
      dVar11 = *pdVar7;
      pUVar1 = (this->
               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               ).
               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .c_;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(_y_local->super_PostLToLabelId).postl_to_label_id_,(long)x_size);
      local_120 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar1,*pvVar6);
      local_120 = dVar11 + local_120;
      pdVar7 = data_structures::BandMatrix<double>::read_at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)(x_off + -1),(long)(y_off + -1));
      dVar11 = *pdVar7;
      pUVar1 = (this->
               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               ).
               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               .c_;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2_local->super_PostLToLabelId).postl_to_label_id_,(long)k_local);
      iVar5 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(_y_local->super_PostLToLabelId).postl_to_label_id_,(long)x_size);
      local_118 = cost_model::UnitCostModelLD<label::StringLabel>::ren(pUVar1,iVar5,*pvVar6);
      local_118 = dVar11 + local_118;
      local_110 = &local_128;
      local_108 = 3;
      __l._M_len = 3;
      __l._M_array = local_110;
      pTStack_58 = (TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                    *)std::min<double>(__l);
      this_local = pTStack_58;
      if ((double)e < (double)pTStack_58) {
        this_local = (TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)std::numeric_limits<double>::infinity();
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78)
      ;
      return (double)this_local;
    }
    piVar9 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                          *)local_a0);
    local_a4 = *piVar9;
    if (0 < (local_a4 - e) + -1) {
      dVar11 = std::numeric_limits<double>::infinity();
      pdVar7 = data_structures::BandMatrix<double>::at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)local_a4,(long)(~e + local_a4));
      *pdVar7 = dVar11;
    }
    local_bc[1] = 1;
    local_bc[0] = local_a4 - e;
    piVar8 = std::max<int>(local_bc + 1,local_bc);
    local_bc[2] = *piVar8;
    while( true ) {
      iVar5 = local_bc[2];
      local_c0 = local_a4 + e;
      piVar8 = std::min<int>(&local_c0,&y_off);
      iVar2 = local_bc[2];
      if (*piVar8 < iVar5) break;
      bVar4 = false;
      if (local_a4 == x_off) {
        local_c4 = local_a4 + e;
        piVar8 = std::min<int>(&local_c4,&y_off);
        bVar4 = iVar2 == *piVar8;
      }
      if (bVar4) break;
      (this->
      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      ).
      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
      subproblem_counter_ =
           (this->
           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           ).
           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
           .super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
           subproblem_counter_ + 1;
      iVar5 = (local_a4 + j) - (local_bc[2] + i_1);
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      if (y_size < iVar5) {
        dVar11 = std::numeric_limits<double>::infinity();
        pdVar7 = data_structures::BandMatrix<double>::at
                           (&(this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .fd_,(long)local_a4,(long)local_bc[2]);
        *pdVar7 = dVar11;
      }
      else {
        pTStack_58 = (TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)std::numeric_limits<double>::infinity();
        pdVar7 = data_structures::BandMatrix<double>::read_at
                           (&(this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .fd_,(long)local_a4,(long)(local_bc[2] + -1));
        dVar11 = *pdVar7;
        pUVar1 = (this->
                 super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                 ).
                 super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                 .
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                 .c_;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(_y_local->super_PostLToLabelId).postl_to_label_id_,
                            (long)(local_bc[2] + i_1));
        dVar10 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar1,*pvVar6);
        td_read = dVar11 + dVar10;
        pdVar7 = std::min<double>((double *)&stack0xffffffffffffffa8,&td_read);
        pTStack_58 = (TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)*pdVar7;
        pdVar7 = data_structures::BandMatrix<double>::read_at
                           (&(this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .td_,(long)(local_a4 + j),(long)(local_bc[2] + i_1));
        iVar2 = local_a4;
        fd_read = *pdVar7;
        local_e0 = 0.0;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2_local->super_PostLToSize).postl_to_size_,(long)(local_a4 + j));
        iVar5 = local_bc[2];
        if ((iVar2 != *pvVar6) ||
           (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(_y_local->super_PostLToSize).postl_to_size_,
                                (long)(local_bc[2] + i_1)), iVar5 != *pvVar6)) {
          iVar2 = local_bc[2];
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(_y_local->super_PostLToSize).postl_to_size_,
                              (long)(local_bc[2] + i_1));
          iVar3 = local_a4;
          iVar5 = *pvVar6;
          local_e8[1] = 0;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToSize).postl_to_size_,(long)(local_a4 + j));
          local_e8[0] = ((iVar3 - *pvVar6) - e) + -1;
          piVar8 = std::max<int>(local_e8 + 1,local_e8);
          iVar3 = local_a4;
          if (iVar2 - iVar5 < *piVar8) {
            local_e0 = std::numeric_limits<double>::infinity();
          }
          else {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(t2_local->super_PostLToSize).postl_to_size_,(long)(local_a4 + j));
            local_ec = (iVar3 - *pvVar6) + e + 1;
            piVar8 = std::min<int>(&local_ec,&y_off);
            iVar2 = local_bc[2];
            iVar5 = *piVar8;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(_y_local->super_PostLToSize).postl_to_size_,
                                (long)(local_bc[2] + i_1));
            iVar3 = local_a4;
            if (iVar5 < iVar2 - *pvVar6) {
              local_e0 = std::numeric_limits<double>::infinity();
            }
            else {
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(t2_local->super_PostLToSize).postl_to_size_,(long)(local_a4 + j)
                                 );
              iVar2 = local_bc[2];
              iVar5 = *pvVar6;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(_y_local->super_PostLToSize).postl_to_size_,
                                  (long)(local_bc[2] + i_1));
              pdVar7 = data_structures::BandMatrix<double>::read_at
                                 (&(this->
                                   super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   ).
                                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   .fd_,(long)(iVar3 - iVar5),(long)(iVar2 - *pvVar6));
              local_e0 = *pdVar7;
            }
          }
        }
        local_f8 = local_e0 + fd_read;
        pdVar7 = std::min<double>((double *)&stack0xffffffffffffffa8,&local_f8);
        pTStack_58 = (TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      *)*pdVar7;
        if (local_a4 == 1) {
LAB_001067c0:
          pdVar7 = data_structures::BandMatrix<double>::read_at
                             (&(this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_,(long)(local_a4 + -1),(long)local_bc[2]);
          dVar11 = *pdVar7;
          pUVar1 = (this->
                   super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   ).
                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   .
                   super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   .c_;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToLabelId).postl_to_label_id_,
                              (long)(local_a4 + j));
          local_100 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar1,*pvVar6);
          local_100 = dVar11 + local_100;
          pdVar7 = std::min<double>((double *)&stack0xffffffffffffffa8,&local_100);
          pTStack_58 = (TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        *)*pdVar7;
        }
        else if (1 < local_a4) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::at
                             (&(t2_local->super_PostLToDepth).postl_to_depth_,
                              (long)(local_a4 + -1 + j));
          iVar5 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2_local->super_PostLToDepth).postl_to_depth_,(long)k_local);
          if (iVar5 - *pvVar6 <= e + 1) goto LAB_001067c0;
        }
        dVar11 = (double)pTStack_58;
        if ((double)pTStack_58 <= (double)e) {
          pdVar7 = data_structures::BandMatrix<double>::at
                             (&(this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_,(long)local_a4,(long)local_bc[2]);
          *pdVar7 = dVar11;
        }
        else {
          dVar11 = std::numeric_limits<double>::infinity();
          pdVar7 = data_structures::BandMatrix<double>::at
                             (&(this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_,(long)local_a4,(long)local_bc[2]);
          *pdVar7 = dVar11;
        }
      }
      local_bc[2] = local_bc[2] + 1;
    }
    if (local_a4 + e + 1 <= y_off) {
      dVar11 = std::numeric_limits<double>::infinity();
      pdVar7 = data_structures::BandMatrix<double>::at
                         (&(this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_,(long)local_a4,(long)(local_a4 + 1 + e));
      *pdVar7 = dVar11;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                  *)local_a0);
  } while( true );
}

Assistant:

double TouzetDepthPruningTruncatedTreeFixTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];

  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = 0;

  // Collect all nodes in truncated tree to traverse.
  std::vector<int> nodes_to_traverse; // Normalized to current subtree: 1..|x|.
  // NOTE: If we can't truncate anything, all the nodes from the subtree have
  //       to be traversed.
  if (t1.postl_to_subtree_max_depth_.at(x) <= t1.postl_to_depth_.at(x) + e + 1) {
    max_depth = t1.postl_to_subtree_max_depth_.at(x);
    for (int n = x_size; n >= 1; --n) {
      nodes_to_traverse.push_back(n);
    }
  } else {
    max_depth = t1.postl_to_depth_.at(x) + e + 1;
    int n = 1;
    int post_n = 0;
    int depth_n = 0;
    while (n <= x_size) { // Loop in right-to-left-preorder
      post_n = x_size - n + 1 + x_off;
      depth_n = t1.postl_to_depth_.at(post_n);
      // if (depth_n <= max_depth) { // NOTE: depth_n < max_depth is always satisfied.
        nodes_to_traverse.push_back(x_size - n + 1);
        if (depth_n == max_depth) {// Jump to the next node to the left with the max_depth.
          n += t1.postl_to_size_.at(post_n);
        } else {
          ++n;
        }
      // }
    }
  }

  // Traversing truncated tree to filter out i-values based on depth.
  typename std::vector<int>::reverse_iterator rit = nodes_to_traverse.rbegin();
  int i;
  for (; rit != nodes_to_traverse.rend(); ++rit) {
    i = *rit;
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
  }

  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}